

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  CppType CVar1;
  Extension *this_local;
  
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      CVar1 = anon_unknown_0::cpp_type(this->type);
      if (CVar1 == CPPTYPE_STRING) {
        std::__cxx11::string::clear();
      }
      else if (CVar1 == CPPTYPE_MESSAGE) {
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 8))();
        }
        else {
          (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x16))();
        }
      }
      this->field_0xa = this->field_0xa & 0xf0 | 1;
    }
  }
  else {
    CVar1 = anon_unknown_0::cpp_type(this->type);
    switch(CVar1) {
    case CPPTYPE_INT32:
      RepeatedField<int>::Clear((this->field_0).repeated_int32_value);
      break;
    case CPPTYPE_INT64:
      RepeatedField<long>::Clear((this->field_0).repeated_int64_value);
      break;
    case CPPTYPE_UINT32:
      RepeatedField<unsigned_int>::Clear((this->field_0).repeated_uint32_value);
      break;
    case CPPTYPE_UINT64:
      RepeatedField<unsigned_long>::Clear((this->field_0).repeated_uint64_value);
      break;
    case CPPTYPE_DOUBLE:
      RepeatedField<double>::Clear((this->field_0).repeated_double_value);
      break;
    case CPPTYPE_FLOAT:
      RepeatedField<float>::Clear((this->field_0).repeated_float_value);
      break;
    case CPPTYPE_BOOL:
      RepeatedField<bool>::Clear((this->field_0).repeated_bool_value);
      break;
    case CPPTYPE_ENUM:
      RepeatedField<int>::Clear((this->field_0).repeated_int32_value);
      break;
    case CPPTYPE_STRING:
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Clear((this->field_0).repeated_string_value);
      break;
    case CPPTYPE_MESSAGE:
      RepeatedPtrField<google::protobuf::MessageLite>::Clear((this->field_0).repeated_message_value)
      ;
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                          \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
        repeated_##LOWERCASE##_value->Clear();                     \
        break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            lazymessage_value->Clear();
          } else {
            message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}